

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

int Curl_ssl_backend(void)

{
  multissl_setup((Curl_ssl *)0x0);
  return (Curl_ssl->info).id;
}

Assistant:

int Curl_ssl_backend(void)
{
#ifdef USE_SSL
  multissl_setup(NULL);
  return Curl_ssl->info.id;
#else
  return (int)CURLSSLBACKEND_NONE;
#endif
}